

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionTest.cpp
# Opt level: O1

void __thiscall
AssertionTest_assertGtHandlerShouldNotBeCalled_Test::
~AssertionTest_assertGtHandlerShouldNotBeCalled_Test
          (AssertionTest_assertGtHandlerShouldNotBeCalled_Test *this)

{
  pointer pcVar1;
  
  (this->super_AssertionTest).super_Test._vptr_Test = (_func_int **)&PTR__AssertionTest_0017a550;
  pcVar1 = (this->super_AssertionTest).expectedStreamMessage_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_AssertionTest).expectedStreamMessage_.field_2) {
    operator_delete(pcVar1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(AssertionTest, assertGtHandlerShouldNotBeCalled)
{
    std::int32_t a = 2;
    std::int32_t b = 1;
    CPP_ASSERT_GT(a, b);
    EXPECT_EQ(0, assertionHandlerCounter_);

    SET_EXPECTED_MSG(a, b);
    CPP_ASSERT_GT(a, b, EXPECTED_TEST_MSG(a,b));
    EXPECT_EQ(0, assertionHandlerCounter_);
}